

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseExternalPalSpec(char *arg)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  size_t __n;
  long lVar5;
  filebuf file;
  char acStack_108 [240];
  
  pcVar2 = strchr(arg,0x3a);
  if (pcVar2 == (char *)0x0) {
    error("External palette spec must have format `fmt:path` (missing colon)");
    return;
  }
  __n = (long)pcVar2 - (long)arg;
  iVar1 = strncasecmp(arg,"PSP",__n);
  if (iVar1 == 0) {
    lVar5 = 0;
  }
  else {
    iVar1 = strncasecmp(arg,"GPL",__n);
    if (iVar1 == 0) {
      lVar5 = 0x18;
    }
    else {
      iVar1 = strncasecmp(arg,"HEX",__n);
      if (iVar1 == 0) {
        lVar5 = 0x30;
      }
      else {
        iVar1 = strncasecmp(arg,"ACT",__n);
        if (iVar1 != 0) {
          iVar1 = strncasecmp(arg,"ACO",__n);
          if (iVar1 == 0) {
            lVar5 = 0x11ed40;
          }
          else {
            iVar1 = strncasecmp(arg,"GBC",__n);
            if (iVar1 != 0) {
              sVar4 = 0x7fffffff;
              if ((long)__n < 0x7fffffff) {
                sVar4 = __n;
              }
              error("Unknown external palette format \"%.*s\"",sVar4,arg);
              return;
            }
            lVar5 = 0x11ed58;
          }
          goto LAB_0010c4f3;
        }
        lVar5 = 0x48;
      }
    }
  }
  lVar5 = (long)&parseExternalPalSpec::parsers._M_elems[0].
                 super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                 .
                 super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                 .super__Tuple_impl<2UL,_std::_Ios_Openmode>.
                 super__Head_base<2UL,_std::_Ios_Openmode,_false>._M_head_impl + lVar5;
LAB_0010c4f3:
  std::filebuf::filebuf(acStack_108);
  lVar3 = std::filebuf::open(acStack_108,(_Ios_Openmode)(pcVar2 + 1));
  if (lVar3 == 0) {
    error("Failed to open palette file \"%s\"",pcVar2 + 1);
  }
  else {
    (**(code **)(lVar5 + 8))(acStack_108);
  }
  std::filebuf::~filebuf(acStack_108);
  return;
}

Assistant:

void parseExternalPalSpec(char const *arg) {
	// `fmt:path`, parse the file according to the given format

	// Split both parts, error out if malformed
	char const *ptr = strchr(arg, ':');
	if (ptr == nullptr) {
		error("External palette spec must have format `fmt:path` (missing colon)");
		return;
	}
	char const *path = ptr + 1;

	static std::array parsers{
	    std::tuple{"PSP", &parsePSPFile, std::ios::in    },
	    std::tuple{"GPL", &parseGPLFile, std::ios::in    },
	    std::tuple{"HEX", &parseHEXFile, std::ios::in    },
	    std::tuple{"ACT", &parseACTFile, std::ios::binary},
	    std::tuple{"ACO", &parseACOFile, std::ios::binary},
	    std::tuple{"GBC", &parseGBCFile, std::ios::binary},
	};

	auto iter = std::find_if(parsers.begin(), parsers.end(),
	                         [&arg, &ptr](decltype(parsers)::value_type const &parser) {
		                         return strncasecmp(arg, std::get<0>(parser), ptr - arg) == 0;
	                         });
	if (iter == parsers.end()) {
		error("Unknown external palette format \"%.*s\"",
		      static_cast<int>(std::min(ptr - arg, static_cast<decltype(ptr - arg)>(INT_MAX))),
		      arg);
		return;
	}

	std::filebuf file;
	// Some parsers read the file in text mode, others in binary mode
	if (!file.open(path, std::ios::in | std::get<2>(*iter))) {
		error("Failed to open palette file \"%s\"", path);
		return;
	}

	std::get<1> (*iter)(file);
}